

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::ByteCodeWriter::RecordStartScopeObject
          (ByteCodeWriter *this,DiagExtraScopesType scopeType,RegSlot scopeLocation,int *index)

{
  RegSlot scopeLocation_00;
  DebuggerScope *debuggerScope;
  
  if (scopeLocation == 0xffffffff) {
    scopeLocation_00 = 0xffffffff;
  }
  else {
    scopeLocation_00 = ConsumeReg(this,scopeLocation);
  }
  debuggerScope =
       FunctionBody::RecordStartScopeObject
                 (this->m_functionWrite,scopeType,(this->m_byteCodeData).currentOffset,
                  scopeLocation_00,index);
  PushDebuggerScope(this,debuggerScope);
  return debuggerScope;
}

Assistant:

DebuggerScope* ByteCodeWriter::RecordStartScopeObject(DiagExtraScopesType scopeType, RegSlot scopeLocation, int* index)
    {
        if (scopeLocation != Js::Constants::NoRegister)
        {
            scopeLocation = ConsumeReg(scopeLocation);
        }
        DebuggerScope* debuggerScope = m_functionWrite->RecordStartScopeObject(scopeType, m_byteCodeData.GetCurrentOffset(), scopeLocation, index);
        PushDebuggerScope(debuggerScope);
        return debuggerScope;
    }